

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseConstList(WastParser *this,ConstVector *consts,ConstType type)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  bool local_1a9;
  Location local_198;
  undefined1 local_178 [8];
  Token token_1;
  Location local_130;
  Enum local_10c;
  Type local_108;
  Type type_1;
  Token token;
  undefined1 local_b8 [8];
  Const const_;
  ConstType type_local;
  ConstVector *consts_local;
  WastParser *this_local;
  
  while( true ) {
    bVar1 = PeekMatchLpar(this,Const);
    local_1a9 = true;
    if (!bVar1) {
      bVar1 = PeekMatchLpar(this,RefNull);
      local_1a9 = true;
      if (!bVar1) {
        bVar1 = PeekMatchLpar(this,RefExtern);
        local_1a9 = true;
        if (!bVar1) {
          local_1a9 = PeekMatchLpar(this,RefFunc);
        }
      }
    }
    if (local_1a9 == false) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    Consume((Token *)(const_.nan_ + 2),this);
    Const::Const((Const *)local_b8);
    TVar2 = Peek(this,0);
    switch(TVar2) {
    case Const:
      RVar3 = ParseConst(this,(Const *)local_b8,type);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      break;
    default:
      __assert_fail("!\"unreachable\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0xb05,"Result wabt::WastParser::ParseConstList(ConstVector *, ConstType)");
    case RefExtern:
      RVar3 = ParseExternref(this,(Const *)local_b8);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      break;
    case RefFunc:
      Consume((Token *)local_178,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)local_178);
      GetLocation(&local_198,this);
      local_b8 = (undefined1  [8])local_198.filename._M_len;
      const_.loc.filename._M_len = (size_t)local_198.filename._M_str;
      const_.loc.filename._M_str = (char *)local_198.field_1.field_1.offset;
      const_.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           local_198.field_1._8_8_;
      Const::set_funcref((Const *)local_b8);
      break;
    case RefNull:
      Consume((Token *)&type_1,this);
      local_10c = (Enum)ParseRefKind(this,&local_108);
      bVar1 = Failed((Result)local_10c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      ErrorUnlessOpcodeEnabled(this,(Token *)&type_1);
      GetLocation(&local_130,this);
      local_b8 = (undefined1  [8])local_130.filename._M_len;
      const_.loc.filename._M_len = (size_t)local_130.filename._M_str;
      const_.loc.filename._M_str = (char *)local_130.field_1.field_1.offset;
      const_.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           local_130.field_1._8_8_;
      token_1.field_2._16_8_ = local_108;
      Const::set_null((Const *)local_b8,local_108);
    }
    RVar3 = Expect(this,Rpar);
    bVar1 = Failed(RVar3);
    if (bVar1) break;
    std::vector<wabt::Const,_std::allocator<wabt::Const>_>::push_back(consts,(value_type *)local_b8)
    ;
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseConstList(ConstVector* consts, ConstType type) {
  WABT_TRACE(ParseConstList);
  while (PeekMatchLpar(TokenType::Const) || PeekMatchLpar(TokenType::RefNull) ||
         PeekMatchLpar(TokenType::RefExtern) ||
         PeekMatchLpar(TokenType::RefFunc)) {
    Consume();
    Const const_;
    switch (Peek()) {
      case TokenType::Const:
        CHECK_RESULT(ParseConst(&const_, type));
        break;
      case TokenType::RefNull: {
        auto token = Consume();
        Type type;
        CHECK_RESULT(ParseRefKind(&type));
        ErrorUnlessOpcodeEnabled(token);
        const_.loc = GetLocation();
        const_.set_null(type);
        break;
      }
      case TokenType::RefFunc: {
        auto token = Consume();
        ErrorUnlessOpcodeEnabled(token);
        const_.loc = GetLocation();
        const_.set_funcref();
        break;
      }
      case TokenType::RefExtern:
        CHECK_RESULT(ParseExternref(&const_));
        break;
      default:
        assert(!"unreachable");
        return Result::Error;
    }
    EXPECT(Rpar);
    consts->push_back(const_);
  }

  return Result::Ok;
}